

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KNNValidatorTests.cpp
# Opt level: O0

int testLabelTypeMismatchTest(void)

{
  bool bVar1;
  ostream *poVar2;
  undefined1 local_e8 [84];
  undefined4 local_94;
  Result local_90;
  SingleKdTreeIndex *kdTree;
  NearestNeighborsIndex *nnIndex;
  KNearestNeighborsClassifier *knnClassifier;
  undefined1 local_40 [8];
  Model m1;
  
  CoreML::Specification::Model::Model((Model *)local_40);
  CoreML::KNNValidatorTests::generateInterface((Model *)local_40);
  nnIndex = (NearestNeighborsIndex *)
            CoreML::Specification::Model::mutable_knearestneighborsclassifier((Model *)local_40);
  CoreML::KNNValidatorTests::setNumberOfNeighbors((KNearestNeighborsClassifier *)nnIndex,3,true);
  CoreML::Specification::KNearestNeighborsClassifier::mutable_uniformweighting
            ((KNearestNeighborsClassifier *)nnIndex);
  kdTree = (SingleKdTreeIndex *)
           CoreML::Specification::KNearestNeighborsClassifier::mutable_nearestneighborsindex
                     ((KNearestNeighborsClassifier *)nnIndex);
  CoreML::Specification::NearestNeighborsIndex::mutable_squaredeuclideandistance
            ((NearestNeighborsIndex *)kdTree);
  local_90.m_message._M_storage._M_storage =
       (uchar  [8])
       CoreML::Specification::NearestNeighborsIndex::mutable_singlekdtreeindex
                 ((NearestNeighborsIndex *)kdTree);
  CoreML::Specification::SingleKdTreeIndex::set_leafsize
            ((SingleKdTreeIndex *)local_90.m_message._M_storage._M_storage,0x1e);
  CoreML::validate<(MLModelType)404>(&local_90,(Model *)local_40);
  bVar1 = CoreML::Result::good(&local_90);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/KNNValidatorTests.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x19f);
    poVar2 = std::operator<<(poVar2,": error: ");
    poVar2 = std::operator<<(poVar2,"!((res).good())");
    poVar2 = std::operator<<(poVar2," was false, expected true.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    m1._oneof_case_[0] = 1;
  }
  else {
    CoreML::Specification::KNearestNeighborsClassifier::set_defaultstringlabel
              ((KNearestNeighborsClassifier *)nnIndex,"Default");
    CoreML::validate<(MLModelType)404>((Result *)(local_e8 + 0x28),(Model *)local_40);
    CoreML::Result::operator=(&local_90,(Result *)(local_e8 + 0x28));
    CoreML::Result::~Result((Result *)(local_e8 + 0x28));
    bVar1 = CoreML::Result::good(&local_90);
    if (bVar1) {
      CoreML::Specification::KNearestNeighborsClassifier::mutable_int64classlabels
                ((KNearestNeighborsClassifier *)nnIndex);
      CoreML::validate<(MLModelType)404>((Result *)local_e8,(Model *)local_40);
      CoreML::Result::operator=(&local_90,(Result *)local_e8);
      CoreML::Result::~Result((Result *)local_e8);
      bVar1 = CoreML::Result::good(&local_90);
      if (bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/KNNValidatorTests.cpp"
                                );
        poVar2 = std::operator<<(poVar2,":");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x1ab);
        poVar2 = std::operator<<(poVar2,": error: ");
        poVar2 = std::operator<<(poVar2,"!((res).good())");
        poVar2 = std::operator<<(poVar2," was false, expected true.");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        m1._oneof_case_[0] = 1;
      }
      else {
        m1._oneof_case_[0] = 0;
      }
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/KNNValidatorTests.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x1a5);
      poVar2 = std::operator<<(poVar2,": error: ");
      poVar2 = std::operator<<(poVar2,"(res).good()");
      poVar2 = std::operator<<(poVar2," was false, expected true.");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      m1._oneof_case_[0] = 1;
    }
  }
  local_94 = 1;
  CoreML::Result::~Result(&local_90);
  CoreML::Specification::Model::~Model((Model *)local_40);
  return m1._oneof_case_[0];
}

Assistant:

int testLabelTypeMismatchTest() {
    
    Specification::Model m1;
    
    KNNValidatorTests::generateInterface(m1);
    
    auto *knnClassifier = m1.mutable_knearestneighborsclassifier();
    KNNValidatorTests::setNumberOfNeighbors(knnClassifier, 3, true);
    knnClassifier->mutable_uniformweighting();
    
    auto *nnIndex = knnClassifier->mutable_nearestneighborsindex();
    nnIndex->mutable_squaredeuclideandistance();
    auto *kdTree = nnIndex->mutable_singlekdtreeindex();
    kdTree->set_leafsize(30);
    
    // Validation should fail since we are not telling the label type.
    Result res = validate<MLModelType_kNearestNeighborsClassifier>(m1);
    ML_ASSERT_BAD(res);
    
    knnClassifier->set_defaultstringlabel("Default");
    
    // Validation should pass now.
    res = validate<MLModelType_kNearestNeighborsClassifier>(m1);
    ML_ASSERT_GOOD(res);
    
    knnClassifier->mutable_int64classlabels();
    
    // Validation should fail due to mismatch in type
    res = validate<MLModelType_kNearestNeighborsClassifier>(m1);
    ML_ASSERT_BAD(res);
    
    return 0;
    
}